

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retire_cid.c
# Opt level: O1

void quicly_retire_cid_shift(quicly_retire_cid_set_t *set,size_t num_shift)

{
  if (8 < num_shift) {
    __assert_fail("num_shift <= PTLS_ELEMENTSOF(set->sequences)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/retire_cid.c"
                  ,0x32,"void quicly_retire_cid_shift(quicly_retire_cid_set_t *, size_t)");
  }
  if (num_shift <= set->_num_pending) {
    memmove(set,set->sequences + num_shift,(set->_num_pending - num_shift) * 8);
    set->_num_pending = set->_num_pending - num_shift;
    return;
  }
  __assert_fail("num_shift <= set->_num_pending",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/retire_cid.c"
                ,0x33,"void quicly_retire_cid_shift(quicly_retire_cid_set_t *, size_t)");
}

Assistant:

void quicly_retire_cid_shift(quicly_retire_cid_set_t *set, size_t num_shift)
{
    assert(num_shift <= PTLS_ELEMENTSOF(set->sequences));
    assert(num_shift <= set->_num_pending);
    /* move the remaining pending sequence numbers to the front */
    memmove(set->sequences, set->sequences + num_shift, sizeof(set->sequences[0]) * (set->_num_pending - num_shift));
    set->_num_pending -= num_shift;
}